

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitTrapezoidal.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::integrators::ImplicitTrapezoidal::
evaluateCollocationConstraintSecondDerivatives
          (ImplicitTrapezoidal *this,double time,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
          *collocationPoints,
          vector<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_> *controlInputs,
          double dT,VectorDynSize *lambda,CollocationHessianMap *stateSecondDerivative,
          CollocationHessianMap *controlSecondDerivative,
          CollocationHessianMap *stateControlSecondDerivative)

{
  VectorDynSize *pVVar1;
  MatrixDynSize *pMVar2;
  double *pdVar3;
  double *pdVar4;
  element_type *peVar5;
  double dVar6;
  int iVar7;
  Index size;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  string *psVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  pointer pcVar18;
  double dVar19;
  ostringstream errorMsg;
  long *local_1e0;
  long local_1d0 [2];
  MatrixDynSize *local_1c0;
  MatrixDynSize *local_1b8;
  MatrixDynSize *local_1b0;
  CollocationHessianIndex local_1a8 [7];
  ios_base local_138 [264];
  
  peVar5 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
           super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar5 == (element_type *)0x0) {
    psVar13 = IntegratorInfo::name_abi_cxx11_
                        (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
    pcVar18 = (psVar13->_M_dataplus)._M_p;
    pcVar15 = "Dynamical system not set.";
LAB_00174aac:
    iDynTree::reportError(pcVar18,"evaluateCollocationConstraintSecondDerivatives",pcVar15);
  }
  else {
    if ((long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(collocationPoints->
              super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>)
              ._M_impl.super__Vector_impl_data._M_start == 0x40) {
      if ((long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(controlInputs->
                super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                )._M_impl.super__Vector_impl_data._M_start == 0x40) {
        iVar7 = (*peVar5->_vptr_DynamicalSystem[3])();
        if ((char)iVar7 == '\0') {
LAB_00174bfe:
          psVar13 = IntegratorInfo::name_abi_cxx11_
                              (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
          pcVar18 = (psVar13->_M_dataplus)._M_p;
          pcVar15 = "Error while setting the control input.";
        }
        else {
          lVar8 = iDynTree::VectorDynSize::data();
          iDynTree::VectorDynSize::size();
          pVVar1 = &this->m_lambda;
          uVar9 = iDynTree::VectorDynSize::data();
          uVar10 = iDynTree::VectorDynSize::size();
          uVar14 = uVar10;
          if (((uVar9 & 7) == 0) &&
             (uVar14 = (ulong)((uint)(uVar9 >> 3) & 1), (long)uVar10 <= (long)uVar14)) {
            uVar14 = uVar10;
          }
          dVar19 = dT * 0.5;
          lVar16 = uVar10 - uVar14;
          if (0 < (long)uVar14) {
            uVar17 = 0;
            do {
              *(double *)(uVar9 + uVar17 * 8) = *(double *)(lVar8 + uVar17 * 8) * dVar19;
              uVar17 = uVar17 + 1;
            } while (uVar14 != uVar17);
          }
          uVar17 = (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU) + uVar14;
          if (1 < lVar16) {
            do {
              pdVar3 = (double *)(lVar8 + uVar14 * 8);
              dVar6 = pdVar3[1];
              pdVar4 = (double *)(uVar9 + uVar14 * 8);
              *pdVar4 = *pdVar3 * dVar19;
              pdVar4[1] = dVar6 * dVar19;
              uVar14 = uVar14 + 2;
            } while ((long)uVar14 < (long)uVar17);
          }
          if ((long)uVar17 < (long)uVar10) {
            do {
              *(double *)(uVar9 + uVar17 * 8) = *(double *)(lVar8 + uVar17 * 8) * dVar19;
              uVar17 = uVar17 + 1;
            } while (uVar10 != uVar17);
          }
          peVar5 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                   super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          pMVar2 = &this->m_stateHessianBuffer;
          iVar7 = (*peVar5->_vptr_DynamicalSystem[0xd])
                            (time,peVar5,
                             (collocationPoints->
                             super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                             )._M_impl.super__Vector_impl_data._M_start,pVVar1,pMVar2);
          if ((char)iVar7 == '\0') {
LAB_00174c20:
            psVar13 = IntegratorInfo::name_abi_cxx11_
                                (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar18 = (psVar13->_M_dataplus)._M_p;
            pcVar15 = "Error while evaluating the dynamical system state second derivative.";
          }
          else {
            CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,0);
            pmVar11 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[](stateSecondDerivative,local_1a8);
            local_1b0 = pMVar2;
            iDynTree::MatrixDynSize::operator=(pmVar11,pMVar2);
            CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,1);
            pmVar11 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[](stateSecondDerivative,local_1a8);
            iDynTree::MatrixDynSize::operator=(pmVar11,&this->m_zeroNxNxBuffer);
            peVar5 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            pMVar2 = &this->m_controlHessianBuffer;
            iVar7 = (*peVar5->_vptr_DynamicalSystem[0xe])
                              (time,peVar5,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start,pVVar1,pMVar2);
            if ((char)iVar7 == '\0') {
LAB_00174c42:
              psVar13 = IntegratorInfo::name_abi_cxx11_
                                  (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
              pcVar18 = (psVar13->_M_dataplus)._M_p;
              pcVar15 = "Error while evaluating the dynamical system control second derivative.";
              goto LAB_00174aac;
            }
            CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,0);
            pmVar11 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[](controlSecondDerivative,local_1a8);
            local_1b8 = pMVar2;
            iDynTree::MatrixDynSize::operator=(pmVar11,pMVar2);
            CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,1);
            pmVar11 = std::
                      map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                      ::operator[](controlSecondDerivative,local_1a8);
            iDynTree::MatrixDynSize::operator=(pmVar11,&this->m_zeroNuNuBuffer);
            peVar5 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                     super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            pMVar2 = &this->m_mixedHessianBuffer;
            iVar7 = (*peVar5->_vptr_DynamicalSystem[0xf])
                              (time,peVar5,
                               (collocationPoints->
                               super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                               )._M_impl.super__Vector_impl_data._M_start,pVVar1,pMVar2);
            if ((char)iVar7 != '\0') {
              CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,0);
              pmVar11 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[](stateControlSecondDerivative,local_1a8);
              local_1c0 = pMVar2;
              iDynTree::MatrixDynSize::operator=(pmVar11,pMVar2);
              CollocationHessianIndex::CollocationHessianIndex(local_1a8,0,1);
              pmVar11 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[](stateControlSecondDerivative,local_1a8);
              iDynTree::MatrixDynSize::operator=(pmVar11,&this->m_zeroNxNuBuffer);
              CollocationHessianIndex::CollocationHessianIndex(local_1a8,1,0);
              pmVar11 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[](stateControlSecondDerivative,local_1a8);
              iDynTree::MatrixDynSize::operator=(pmVar11,&this->m_zeroNxNuBuffer);
              peVar5 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              iVar7 = (*peVar5->_vptr_DynamicalSystem[3])
                                (peVar5,(controlInputs->
                                        super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 0x20);
              pMVar2 = local_1b0;
              if ((char)iVar7 == '\0') goto LAB_00174bfe;
              peVar5 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              iVar7 = (*peVar5->_vptr_DynamicalSystem[0xd])
                                (peVar5,(collocationPoints->
                                        super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                        )._M_impl.super__Vector_impl_data._M_start + 0x20,pVVar1,
                                 local_1b0);
              if ((char)iVar7 == '\0') goto LAB_00174c20;
              CollocationHessianIndex::CollocationHessianIndex(local_1a8,1,1);
              pmVar11 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[](stateSecondDerivative,local_1a8);
              iDynTree::MatrixDynSize::operator=(pmVar11,pMVar2);
              pMVar2 = local_1b8;
              peVar5 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              iVar7 = (*peVar5->_vptr_DynamicalSystem[0xe])
                                (time + dT,peVar5,
                                 (collocationPoints->
                                 super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x20,pVVar1,local_1b8)
              ;
              if ((char)iVar7 == '\0') goto LAB_00174c42;
              CollocationHessianIndex::CollocationHessianIndex(local_1a8,1,1);
              pmVar11 = std::
                        map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                        ::operator[](controlSecondDerivative,local_1a8);
              iDynTree::MatrixDynSize::operator=(pmVar11,pMVar2);
              pMVar2 = local_1c0;
              peVar5 = (this->super_FixedStepIntegrator).super_Integrator.m_dynamicalSystem_ptr.
                       super___shared_ptr<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              iVar7 = (*peVar5->_vptr_DynamicalSystem[0xf])
                                (time + dT,peVar5,
                                 (collocationPoints->
                                 super__Vector_base<iDynTree::VectorDynSize,_std::allocator<iDynTree::VectorDynSize>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 0x20,pVVar1,local_1c0)
              ;
              if ((char)iVar7 != '\0') {
                CollocationHessianIndex::CollocationHessianIndex(local_1a8,1,1);
                pmVar11 = std::
                          map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_iDynTree::MatrixDynSize>_>_>
                          ::operator[](stateControlSecondDerivative,local_1a8);
                iDynTree::MatrixDynSize::operator=(pmVar11,pMVar2);
                return true;
              }
            }
            psVar13 = IntegratorInfo::name_abi_cxx11_
                                (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
            pcVar18 = (psVar13->_M_dataplus)._M_p;
            pcVar15 = 
            "Error while evaluating the dynamical system second derivative wrt state and control.";
          }
        }
        goto LAB_00174aac;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The size of the matrix containing the control inputs does not match the expected one. Input = "
                 ,0x5e);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,", Expected = 2.",0xf);
      psVar13 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar15 = (psVar13->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar15,"evaluateCollocationConstraintSecondDerivatives",(char *)local_1e0);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "The size of the matrix containing the collocation point does not match the expected one. Input = "
                 ,0x61);
      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,", Expected = 2.",0xf);
      psVar13 = IntegratorInfo::name_abi_cxx11_
                          (&(this->super_FixedStepIntegrator).super_Integrator.m_info);
      pcVar15 = (psVar13->_M_dataplus)._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError
                (pcVar15,"evaluateCollocationConstraintSecondDerivatives",(char *)local_1e0);
    }
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return false;
}

Assistant:

bool ImplicitTrapezoidal::evaluateCollocationConstraintSecondDerivatives(double time, const std::vector<VectorDynSize> &collocationPoints,
                                                                                     const std::vector<VectorDynSize> &controlInputs, double dT, const VectorDynSize &lambda,
                                                                                     iDynTree::optimalcontrol::integrators::CollocationHessianMap &stateSecondDerivative,
                                                                                     iDynTree::optimalcontrol::integrators::CollocationHessianMap &controlSecondDerivative,
                                                                                     iDynTree::optimalcontrol::integrators::CollocationHessianMap &stateControlSecondDerivative)
            {
                if (!m_dynamicalSystem_ptr){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Dynamical system not set.");
                    return false;
                }

                if (collocationPoints.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the collocation point does not match the expected one. Input = ";
                    errorMsg << collocationPoints.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (controlInputs.size() != 2){
                    std::ostringstream errorMsg;
                    errorMsg << "The size of the matrix containing the control inputs does not match the expected one. Input = ";
                    errorMsg << controlInputs.size() << ", Expected = 2.";
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", errorMsg.str().c_str());
                    return false;
                }

                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[0])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Error while setting the control input.");
                    return false;
                }

                toEigen(m_lambda) = 0.5 * dT * toEigen(lambda);

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTState(time, collocationPoints[0], m_lambda, m_stateHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system state second derivative.");
                    return false;
                }

                stateSecondDerivative[CollocationHessianIndex(0, 0)] = m_stateHessianBuffer;

                stateSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNxBuffer;

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControl(time, collocationPoints[0], m_lambda, m_controlHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system control second derivative.");
                    return false;
                }

                controlSecondDerivative[CollocationHessianIndex(0, 0)] = m_controlHessianBuffer;

                controlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNuNuBuffer;

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControl(time, collocationPoints[0], m_lambda, m_mixedHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system second derivative wrt state and control.");
                    return false;
                }

                stateControlSecondDerivative[CollocationHessianIndex(0, 0)] = m_mixedHessianBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(0, 1)] = m_zeroNxNuBuffer;

                stateControlSecondDerivative[CollocationHessianIndex(1, 0)] = m_zeroNxNuBuffer;


                if (!((m_dynamicalSystem_ptr->setControlInput(controlInputs[1])))){
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives", "Error while setting the control input.");
                    return false;
                }

                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTState(time + dT, collocationPoints[1], m_lambda, m_stateHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system state second derivative.");
                    return false;
                }

                stateSecondDerivative[CollocationHessianIndex(1, 1)] = m_stateHessianBuffer;


                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTControl(time + dT, collocationPoints[1], m_lambda, m_controlHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system control second derivative.");
                    return false;
                }

                controlSecondDerivative[CollocationHessianIndex(1, 1)] = m_controlHessianBuffer;


                if (!(m_dynamicalSystem_ptr->dynamicsSecondPartialDerivativeWRTStateControl(time + dT, collocationPoints[1], m_lambda, m_mixedHessianBuffer))) {
                    reportError(m_info.name().c_str(), "evaluateCollocationConstraintSecondDerivatives",
                                "Error while evaluating the dynamical system second derivative wrt state and control.");
                    return false;
                }

                stateControlSecondDerivative[CollocationHessianIndex(1, 1)] = m_mixedHessianBuffer;

                return true;
            }